

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KvsCommandHandler.hpp
# Opt level: O3

void __thiscall
supermap::cli::KvsCommandHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::
handle(KvsCommandHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *this,
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      *args,ostream *os)

{
  SupermapException *this_00;
  long *plVar1;
  long *plVar2;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->argsLen_ <=
      (ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5)) {
    (*(this->super_Handler)._vptr_Handler[3])(this,args,os);
    return;
  }
  this_00 = (SupermapException *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_90,this->argsLen_);
  std::operator+(&local_50,"Invalid number of arguments, at least ",&local_90);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_70 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar2;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  supermap::SupermapException::SupermapException(this_00,(string *)&local_70);
  __cxa_throw(this_00,&SupermapException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void handle(const std::vector<std::string> &args, std::ostream &os) final {
        try {
            if (args.size() < argsLen_) {
                throw SupermapException(
                    "Invalid number of arguments, at least " + std::to_string(argsLen_) + " expected");
            }
            handleKvs(args, os);
        } catch (const SupermapException &supermapException) {
            os << supermapException.what() << std::endl;
        } catch (const std::exception &e) {
            os << "Critical: " << e.what() << std::endl;
        } catch (...) {
            os << "Unknown error has occurred" << std::endl;
        }
    }